

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9VmConfigure(jx9_vm *pVm,sxi32 nOp,__va_list_tag *ap)

{
  char cVar1;
  jx9_hashmap *pMap;
  sxu32 *psVar2;
  ProcConsumer p_Var3;
  void *pvVar4;
  jx9_io_stream *pjVar5;
  sxi32 sVar6;
  sxu32 sVar7;
  uint uVar8;
  sxi32 sVar9;
  undefined8 *puVar10;
  long *plVar11;
  int *piVar12;
  jx9_value *pjVar13;
  uint *puVar14;
  ushort **ppuVar15;
  SyHashEntry_Pr *pSVar16;
  SyString *pSVar17;
  long lVar18;
  undefined8 *puVar19;
  jx9_io_stream *pjVar20;
  char **ppcVar21;
  char *pcVar22;
  jx9_io_stream *pjVar23;
  int unaff_EBP;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  jx9_value *pjVar27;
  int iVar28;
  byte bVar29;
  char *pcVar30;
  SySet *pSet;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  SySet sHeader;
  SyBlob sWorker;
  sxu32 nIdx;
  SyString local_140;
  SySet local_130;
  SyBlob local_108;
  int local_e4;
  jx9_value *local_e0;
  ushort **local_d8;
  SyString local_d0;
  SyhttpUri local_c0;
  
  switch(nOp) {
  case 1:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    p_Var3 = (ProcConsumer)*puVar10;
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pvVar4 = (void *)*puVar10;
    (pVm->sVmConsumer).xConsumer = p_Var3;
    (pVm->sVmConsumer).pUserData = pvVar4;
    goto LAB_001219c2;
  case 2:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      plVar11 = (long *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      plVar11 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar11 + 1;
    }
    pjVar23 = (jx9_io_stream *)*plVar11;
    pjVar20 = pjVar23;
    if (*(char *)&pjVar23->zName != '\0') {
      pjVar5 = (jx9_io_stream *)((long)&pjVar23->zName + 2);
      do {
        pjVar20 = pjVar5;
        if (*(char *)((long)&pjVar20[-1].xStat + 7) == '\0') {
          pjVar20 = (jx9_io_stream *)((long)&pjVar20[-1].xStat + 7);
          goto LAB_00121764;
        }
        if (*(char *)&pjVar20->zName == '\0') goto LAB_00121764;
        if (*(char *)((long)&pjVar20->zName + 1) == '\0') {
          pjVar20 = (jx9_io_stream *)((long)&pjVar20->zName + 1);
          goto LAB_00121764;
        }
        pjVar5 = (jx9_io_stream *)((long)&pjVar20->zName + 4);
      } while (*(char *)((long)&pjVar20->zName + 2) != '\0');
      pjVar20 = (jx9_io_stream *)((long)&pjVar20->zName + 2);
    }
LAB_00121764:
    uVar8 = (int)pjVar20 - (int)pjVar23;
    uVar31 = uVar8 + 1;
    uVar32 = (ulong)uVar8;
    do {
      if (uVar32 == 0) {
        uVar31 = 0;
        break;
      }
      uVar31 = uVar31 - 1;
      lVar18 = uVar32 - 1;
      uVar32 = uVar32 - 1;
    } while (*(char *)((long)pjVar23 + lVar18) == '/');
    if (uVar31 != 0) {
      uVar32 = (ulong)uVar31;
      ppcVar21 = &pjVar23->zName;
      local_c0.sHost.zString = (char *)pjVar23;
      local_c0.sHost.nByte = uVar31;
      do {
        cVar1 = *(char *)&pjVar23->zName;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar15 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0)) goto LAB_001217c3;
        pjVar23 = (jx9_io_stream *)((long)&pjVar23->zName + 1);
        uVar31 = uVar31 - 1;
      } while (uVar31 != 0);
      uVar31 = 0;
      pjVar23 = (jx9_io_stream *)((long)ppcVar21 + uVar32);
    }
LAB_001217c3:
    bVar33 = uVar31 == 0;
    if (!bVar33) {
      uVar32 = (ulong)uVar31;
      bVar29 = *(byte *)((uVar32 - 1) + (long)pjVar23);
      local_c0.sHost.zString = (char *)pjVar23;
      if (bVar29 < 0xc0) {
        local_c0.sHost.nByte = uVar31;
        ppuVar15 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar15 + (long)(char)bVar29 * 2 + 1) & 0x20) == 0) break;
          bVar33 = uVar32 == 1;
          if (bVar33) goto LAB_001219c2;
          bVar29 = *(byte *)((long)pjVar23 + (uVar32 - 2));
          uVar32 = uVar32 - 1;
          uVar31 = uVar31 - 1;
        } while (bVar29 < 0xc0);
      }
      if (bVar33) {
        return 0;
      }
      pSet = &pVm->aPaths;
      local_c0.sHost.nByte = uVar31;
      goto LAB_0012183d;
    }
    goto LAB_001219c2;
  case 3:
    pVm->bErrReport = 1;
    goto LAB_001219c2;
  case 4:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      piVar12 = (int *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      piVar12 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar12 + 2;
    }
    sVar6 = 0;
    if (*piVar12 - 3U < 0x3fd) {
      pVm->nMaxDepth = *piVar12;
    }
    break;
  case 5:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    *(sxu32 *)*puVar10 = pVm->nOutputLen;
    goto LAB_001219c2;
  case 6:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar30 = (char *)*puVar10;
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar22 = pcVar30;
    if (*pcVar30 != '\0') {
      pcVar26 = pcVar30 + 2;
      do {
        pcVar22 = pcVar26;
        if (pcVar22[-1] == '\0') {
          pcVar22 = pcVar22 + -1;
          goto LAB_00121855;
        }
        if (*pcVar22 == '\0') goto LAB_00121855;
        if (pcVar22[1] == '\0') {
          pcVar22 = pcVar22 + 1;
          goto LAB_00121855;
        }
        pcVar26 = pcVar22 + 4;
      } while (pcVar22[2] != '\0');
      pcVar22 = pcVar22 + 2;
    }
LAB_00121855:
    pjVar13 = (jx9_value *)*puVar10;
    sVar7 = (int)pcVar22 - (int)pcVar30;
    pSVar16 = (SyHashEntry_Pr *)0x0;
    if (((pVm->hSuper).nEntry != 0) && (sVar7 != 0)) {
      pSVar16 = HashGetEntry(&pVm->hSuper,pcVar30,sVar7);
    }
    if (pSVar16 == (SyHashEntry_Pr *)0x0) {
      pjVar27 = jx9VmReserveMemObj(pVm,(sxu32 *)&local_c0);
      if (pjVar27 == (jx9_value *)0x0) {
        sVar6 = -1;
      }
      else {
        jx9MemObjStore(pjVar13,pjVar27);
        sVar6 = SyHashInsert(&pVm->hSuper,pcVar30,sVar7,
                             (void *)((ulong)local_c0.sHost.zString & 0xffffffff));
      }
    }
    else {
      uVar8 = *(uint *)&pSVar16->pUserData;
      local_c0.sHost.zString = (char *)CONCAT44(local_c0.sHost.zString._4_4_,uVar8);
      sVar6 = 0;
      if (uVar8 < (pVm->aMemObj).nUsed) {
        pjVar27 = (jx9_value *)((ulong)(uVar8 * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase);
      }
      else {
        pjVar27 = (jx9_value *)0x0;
      }
      if (pjVar27 != (jx9_value *)0x0) {
        jx9MemObjStore(pjVar13,pjVar27);
      }
    }
    break;
  case 7:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar30 = (char *)*puVar10;
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar14 = (uint *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar14 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 2;
    }
    sVar6 = -3;
    if ((pcVar30 != (char *)0x0) && (*pcVar30 != '\0')) {
      uVar8 = *puVar14;
      if ((int)uVar8 < 0) {
        uVar8 = SyStrlen(pcVar30);
      }
      local_130.eSize = 0x20;
      local_130.nCursor = 0;
      local_130.pBase = (undefined8 *)0x0;
      local_130.nUsed = 0;
      local_130.nSize = 0;
      local_130.pUserData = (void *)0x0;
      local_108.pBlob = (char *)0x0;
      local_108.nByte = 0;
      local_108.mByte = 0;
      local_108.nFlags = 0;
      local_130.pAllocator = &pVm->sAllocator;
      local_108.pAllocator = &pVm->sAllocator;
      if (uVar8 != 0) {
        pcVar22 = pcVar30 + uVar8;
        local_140.zString = pcVar30;
        local_140.nByte = uVar8;
        do {
          cVar1 = *pcVar30;
          if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
             (ppuVar15 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0)) goto LAB_001216e6;
          pcVar30 = pcVar30 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        uVar8 = 0;
        pcVar30 = pcVar22;
      }
LAB_001216e6:
      local_140.zString = pcVar30;
      local_140.nByte = uVar8;
      if (uVar8 != 0) {
        do {
          uVar31 = uVar8 - 1;
          cVar1 = pcVar30[uVar31];
          if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
             (ppuVar15 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0)) goto LAB_0012172a;
          uVar8 = uVar31;
        } while (uVar31 != 0);
        uVar8 = 0;
      }
LAB_0012172a:
      local_140.nByte = uVar8;
      sVar6 = VmGetNextLine(&local_140,&local_d0);
      pcVar30 = "HTTP/1.1";
      if (sVar6 == 0) {
        if ((ulong)local_d0.nByte == 0) {
          sVar6 = -3;
        }
        else {
          pcVar30 = (char *)CONCAT44(local_d0.zString._4_4_,(uint)local_d0.zString);
          pcVar22 = pcVar30 + local_d0.nByte;
          do {
            cVar1 = *pcVar30;
            if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
               (ppuVar15 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0)) break;
            pcVar30 = pcVar30 + 1;
          } while (pcVar30 < pcVar22);
          pcVar26 = pcVar30;
          if (pcVar30 < pcVar22) {
            ppuVar15 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar15 + (long)*pcVar26 * 2 + 1) & 0x20) != 0) break;
              pcVar26 = pcVar26 + 1;
            } while (pcVar26 < pcVar22);
          }
          unaff_EBP = 5;
          if (pcVar30 < pcVar26) {
            lVar18 = 0;
            do {
              sVar6 = SyStrnicmp((char *)((long)&VmHttpProcessFirstLine_azMethods_rel +
                                         (long)*(int *)((long)&VmHttpProcessFirstLine_azMethods_rel
                                                       + lVar18)),pcVar30,
                                 (int)pcVar26 - (int)pcVar30);
              if (sVar6 == 0) {
                unaff_EBP = *(int *)((long)&VmHttpProcessFirstLine_aMethods + lVar18);
                goto LAB_00121a14;
              }
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0x10);
            unaff_EBP = 5;
          }
LAB_00121a14:
          while (((pcVar30 = "HTTP/1.1", pcVar26 < pcVar22 &&
                  (cVar1 = *pcVar26, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
                 (ppuVar15 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
            pcVar26 = pcVar26 + 1;
          }
          pcVar25 = pcVar26;
          if (pcVar26 < pcVar22) {
            ppuVar15 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar15 + (long)*pcVar25 * 2 + 1) & 0x20) != 0) break;
              pcVar25 = pcVar25 + 1;
            } while (pcVar25 < pcVar22);
          }
          if (pcVar26 < pcVar25) {
            VmHttpSplitURI(&local_c0,pcVar26,(int)pcVar25 - (int)pcVar26);
          }
          while (((pcVar25 < pcVar22 && (cVar1 = *pcVar25, (ulong)(long)cVar1 < 0xffffffffffffffc0))
                 && (ppuVar15 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
            pcVar25 = pcVar25 + 1;
          }
          pcVar26 = pcVar25;
          if (pcVar25 < pcVar22) {
            ppuVar15 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar15 + (long)*pcVar26 * 2 + 1) & 0x20) != 0) break;
              pcVar26 = pcVar26 + 1;
            } while (pcVar26 < pcVar22);
          }
          sVar6 = 0;
          if (pcVar25 < pcVar26) {
            sVar9 = SyStrnicmp(pcVar25,"http/1.0",(int)pcVar26 - (int)pcVar25);
            pcVar30 = "HTTP/1.1";
            if (sVar9 == 0) {
              pcVar30 = "HTTP/1.0";
            }
          }
        }
      }
      if (sVar6 == 0) {
        VmHttpExtractHeaders(&local_140,&local_130);
        jx9_vm_config(pVm,8,"SERVER_PROTOCOL",pcVar30,8);
        if (unaff_EBP == 1) {
          pcVar30 = "GET";
        }
        else if (unaff_EBP == 3) {
          pcVar30 = "POST";
        }
        else if (unaff_EBP == 4) {
          pcVar30 = "PUT";
        }
        else {
          pcVar30 = "OTHER";
          if (unaff_EBP == 2) {
            pcVar30 = "HEAD";
          }
        }
        jx9_vm_config(pVm,8,"REQUEST_METHOD",pcVar30,0xffffffff);
        local_e4 = unaff_EBP;
        if ((local_c0.sQuery.nByte != 0) && (unaff_EBP == 1)) {
          jx9_vm_config(pVm,8,"QUERY_STRING");
          VmHttpSplitEncodedQuery(pVm,&local_c0.sQuery,&local_108,0);
        }
        jx9_vm_config(pVm,8,"REQUEST_URI",local_c0.sRaw.zString,(ulong)local_c0.sRaw.nByte);
        jx9_vm_config(pVm,8,"PATH_INFO",local_c0.sPath.zString,(ulong)local_c0.sPath.nByte);
        uVar32 = (ulong)local_c0.sPath.nByte;
        jx9_vm_config(pVm,8,"ORIG_PATH_INFO",local_c0.sPath.zString);
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Accept",6);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_ACCEPT",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Accept-Charset",0xe);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_ACCEPT_CHARSET",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Accept-Encoding",0xf);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_ACCEPT_ENCODING",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Accept-Language",0xf);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_ACCEPT_LANGUAGE",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Connection",10);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_CONNECTION",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Host",4);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_HOST",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Referer",7);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_REFERER",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"User-Agent",10);
        if (pSVar17 != (SyString *)0x0) {
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"HTTP_USER_AGENT",pSVar17->zString);
        }
        pSVar17 = VmHttpExtractHeaderValue(&local_130,"Authorization",0xd);
        if (pSVar17 != (SyString *)0x0) {
          jx9_vm_config(pVm,8,"JX9_AUTH_DIGEST",pSVar17->zString,(ulong)pSVar17->nByte);
          uVar32 = (ulong)pSVar17->nByte;
          jx9_vm_config(pVm,8,"JX9_AUTH",pSVar17->zString);
        }
        pjVar13 = VmExtractSuper(pVm,"_HEADER",7);
        bVar33 = local_130.nUsed != 0;
        ppcVar21 = (char **)(ulong)bVar33;
        local_130.nCursor._0_1_ = bVar33;
        local_130.nCursor._1_3_ = 0;
        puVar10 = (undefined8 *)local_130.pBase;
        if (bVar33) {
          do {
            if ((pjVar13 != (jx9_value *)0x0) && ((pjVar13->iFlags & 0x40) != 0)) {
              uVar32 = (ulong)*(uint *)(puVar10 + 3);
              VmHashmapInsert((jx9_hashmap *)(pjVar13->x).pOther,(char *)*puVar10,
                              *(int *)(puVar10 + 1),(char *)puVar10[2],*(uint *)(puVar10 + 3));
            }
            if (((*(int *)(puVar10 + 1) == 6) &&
                (sVar6 = SyStrnicmp((char *)*puVar10,"Cookie",6), sVar6 == 0)) &&
               (uVar8 = *(uint *)(puVar10 + 3), (ulong)uVar8 != 0)) {
              pcVar30 = (char *)puVar10[2];
              local_e0 = VmExtractSuper(pVm,"_COOKIE",7);
              if ((local_e0 != (jx9_value *)0x0) && ((local_e0->iFlags & 0x40) != 0)) {
                pcVar22 = pcVar30 + uVar8;
                bVar33 = true;
                local_d8 = __ctype_b_loc();
                do {
                  iVar28 = (int)uVar32;
                  bVar29 = *(byte *)((long)*local_d8 + (long)*pcVar30 * 2 + 1);
                  while ((bVar29 & 0x20) != 0) {
                    pcVar30 = pcVar30 + 1;
                    bVar33 = pcVar30 < pcVar22;
                    if (!bVar33) goto LAB_00121eb0;
                    bVar29 = *(byte *)((long)*local_d8 + (long)*pcVar30 * 2 + 1);
                  }
                  if (!bVar33) break;
                  local_108._16_8_ = local_108._16_8_ & 0xffffffff00000000;
                  if ((local_108.nFlags & 4) != 0) {
                    local_108.pBlob = (char *)0x0;
                    local_108.nByte = 0;
                    local_108.mByte = 0;
                    local_108.nFlags = local_108.nFlags & 0xfffffffb;
                  }
                  for (pcVar26 = pcVar30; (pcVar26 < pcVar22 && (*pcVar26 != ';'));
                      pcVar26 = pcVar26 + 1) {
                  }
                  pcVar25 = pcVar30;
                  if (pcVar30 < pcVar26) {
                    lVar18 = (long)pcVar26 - (long)pcVar30;
                    pcVar24 = pcVar30;
                    do {
                      pcVar25 = pcVar24;
                      if (*pcVar24 == '=') break;
                      pcVar24 = pcVar24 + 1;
                      lVar18 = lVar18 + -1;
                      pcVar25 = pcVar26;
                    } while (lVar18 != 0);
                  }
                  SyUriDecode(pcVar30,(int)pcVar25 - (int)pcVar30,jx9VmBlobConsumer,&local_108,
                              iVar28);
                  sVar7 = local_108.nByte;
                  uVar32 = local_108._16_8_ & 0xffffffff;
                  pcVar25 = pcVar25 + 1;
                  if (pcVar25 < pcVar26) {
                    SyUriDecode(pcVar25,(int)pcVar26 - (int)pcVar25,jx9VmBlobConsumer,&local_108,
                                iVar28);
                    pcVar25 = (char *)((long)local_108.pBlob + uVar32);
                    uVar32 = (ulong)(local_108.nByte - sVar7);
                  }
                  else {
                    uVar32 = 0;
                    pcVar25 = (char *)0x0;
                  }
                  pcVar30 = pcVar26 + 1;
                  VmHashmapInsert((jx9_hashmap *)(local_e0->x).pOther,(char *)local_108.pBlob,sVar7,
                                  pcVar25,(int)uVar32);
                  bVar33 = pcVar30 < pcVar22;
                } while (bVar33);
              }
            }
LAB_00121eb0:
            bVar33 = local_130.nCursor < local_130.nUsed;
            if (bVar33) {
              puVar10 = (undefined8 *)
                        ((ulong)(local_130.eSize * local_130.nCursor) + (long)local_130.pBase);
            }
            local_130.nCursor = local_130.nCursor + 1;
            ppcVar21 = (char **)0x0;
            if (!bVar33) {
              local_130.nCursor = 0;
            }
          } while (bVar33);
        }
        if ((((local_e4 == 3) &&
             (pSVar17 = VmHttpExtractHeaderValue(&local_130,"Content-Type",0xc),
             pSVar17 != (SyString *)0x0)) && (0x20 < pSVar17->nByte)) &&
           ((sVar6 = SyMemcmp("application/x-www-form-urlencoded",pSVar17->zString,pSVar17->nByte),
            sVar6 == 0 &&
            (pSVar17 = VmHttpExtractHeaderValue(&local_130,"Content-Length",0xe),
            pSVar17 != (SyString *)0x0)))) {
          local_d0.zString._0_4_ = 0;
          SyStrToInt32(pSVar17->zString,pSVar17->nByte,&local_d0,ppcVar21);
          uVar8 = (uint)local_d0.zString;
          if (0 < (int)(uint)local_d0.zString) {
            uVar32 = (ulong)local_140.nByte;
            pcVar30 = local_140.zString;
            if (uVar32 != 0) {
              pcVar22 = local_140.zString + uVar32;
              do {
                cVar1 = *pcVar30;
                if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
                   (ppuVar15 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0))
                goto LAB_0012216b;
                pcVar30 = pcVar30 + 1;
                uVar31 = (int)uVar32 - 1;
                uVar32 = (ulong)uVar31;
              } while (uVar31 != 0);
              uVar32 = 0;
              pcVar30 = pcVar22;
            }
LAB_0012216b:
            uVar31 = (uint)uVar32;
            local_140.zString = pcVar30;
            local_140.nByte = uVar31;
            if (uVar31 != 0) {
              do {
                uVar31 = (uint)uVar32;
                uVar32 = uVar32 - 1;
                cVar1 = pcVar30[uVar32 & 0xffffffff];
                if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
                   (ppuVar15 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0))
                goto LAB_001221af;
              } while ((int)uVar32 != 0);
              uVar31 = 0;
            }
LAB_001221af:
            local_140.nByte = uVar8;
            if ((int)uVar31 < (int)uVar8) {
              local_140.nByte = uVar31;
            }
            VmHttpSplitEncodedQuery(pVm,&local_140,&local_108,1);
          }
        }
        if (((jx9_vm *)local_130.pAllocator != (jx9_vm *)0x0) &&
           ((undefined8 *)local_130.pBase != (undefined8 *)0x0)) {
          SyMemBackendFree(local_130.pAllocator,local_130.pBase);
        }
        local_130.pBase = (void *)0x0;
        sVar6 = 0;
        local_130._16_8_ = local_130._16_8_ & 0xffffffff00000000;
        local_130._24_8_ = local_130._24_8_ & 0xffffffff;
        if (((local_108.nFlags & 6) == 0) && (local_108.mByte != 0)) {
          SyMemBackendFree(local_108.pAllocator,local_108.pBlob);
        }
      }
    }
    break;
  case 8:
  case 9:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar30 = (char *)*puVar10;
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar22 = (char *)*puVar10;
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      piVar12 = (int *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      piVar12 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar12 + 2;
    }
    iVar28 = *piVar12;
    if (nOp == 9) {
      pcVar26 = "_ENV";
      sVar7 = 4;
    }
    else {
      pcVar26 = "_SERVER";
      sVar7 = 7;
    }
    pjVar13 = VmExtractSuper(pVm,pcVar26,sVar7);
    sVar6 = -6;
    if ((pjVar13 != (jx9_value *)0x0) && ((pjVar13->iFlags & 0x40) != 0)) {
      sVar6 = VmHashmapInsert((jx9_hashmap *)(pjVar13->x).pOther,pcVar30,-1,pcVar22,iVar28);
      return sVar6;
    }
    break;
  case 10:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    *(jx9_value **)*puVar10 = &pVm->sExec;
    goto LAB_001219c2;
  case 0xb:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      plVar11 = (long *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      plVar11 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar11 + 1;
    }
    pjVar23 = (jx9_io_stream *)*plVar11;
    if (pjVar23 == (jx9_io_stream *)0x0) {
      return -9;
    }
    pcVar30 = pjVar23->zName;
    if (pcVar30 == (char *)0x0) {
      return -9;
    }
    if (*pcVar30 == '\0') {
      return -9;
    }
    if (pjVar23->xOpen == (_func_int_char_ptr_int_jx9_value_ptr_void_ptr_ptr *)0x0) {
      return -9;
    }
    if (pjVar23->xRead == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
      return -9;
    }
    local_c0.sHost.zString = (char *)pjVar23;
    if ((pVm->pDefStream == (jx9_io_stream *)0x0) &&
       (sVar6 = SyStrnicmp(pcVar30,"file",4), sVar6 == 0)) {
      pVm->pDefStream = pjVar23;
    }
    pSet = &pVm->aIOstream;
LAB_0012183d:
    sVar6 = SySetPut(pSet,&local_c0);
    break;
  case 0xc:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar30 = (char *)*puVar10;
    pjVar13 = VmExtractSuper(pVm,"argv",4);
    sVar6 = -6;
    if ((pjVar13 != (jx9_value *)0x0) && ((pjVar13->iFlags & 0x40) != 0)) {
      pMap = (jx9_hashmap *)(pjVar13->x).pOther;
      sVar6 = VmHashmapInsert(pMap,(char *)0x0,0,pcVar30,-1);
      if ((pcVar30 != (char *)0x0 && sVar6 == 0) && (*pcVar30 != '\0')) {
        if (1 < pMap->nEntry) {
          SyBlobAppend(&pVm->sArgv," ",1);
        }
        sVar7 = SyStrlen(pcVar30);
        SyBlobAppend(&pVm->sArgv,pcVar30,sVar7);
      }
    }
    break;
  case 0xd:
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    puVar10 = (undefined8 *)*puVar10;
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar19 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar19 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar19 + 1;
    }
    psVar2 = (sxu32 *)*puVar19;
    *puVar10 = (pVm->sConsumer).pBlob;
    *psVar2 = (pVm->sConsumer).nByte;
LAB_001219c2:
    sVar6 = 0;
    break;
  default:
    sVar6 = -0xd;
  }
  return sVar6;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmConfigure(
	jx9_vm *pVm, /* Target VM */
	sxi32 nOp,   /* Configuration verb */
	va_list ap   /* Subsequent option arguments */
	)
{
	sxi32 rc = SXRET_OK;
	switch(nOp){
	case JX9_VM_CONFIG_OUTPUT: {
		ProcConsumer xConsumer = va_arg(ap, ProcConsumer);
		void *pUserData = va_arg(ap, void *);
		/* VM output consumer callback */
#ifdef UNTRUST
		if( xConsumer == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		/* Install the output consumer */
		pVm->sVmConsumer.xConsumer = xConsumer;
		pVm->sVmConsumer.pUserData = pUserData;
		break;
							   }
	case JX9_VM_CONFIG_IMPORT_PATH: {
		/* Import path */
		  const char *zPath;
		  SyString sPath;
		  zPath = va_arg(ap, const char *);
#if defined(UNTRUST)
		  if( zPath == 0 ){
			  rc = SXERR_EMPTY;
			  break;
		  }
#endif
		  SyStringInitFromBuf(&sPath, zPath, SyStrlen(zPath));
		  /* Remove trailing slashes and backslashes */
#ifdef __WINNT__
		  SyStringTrimTrailingChar(&sPath, '\\');
#endif
		  SyStringTrimTrailingChar(&sPath, '/');
		  /* Remove leading and trailing white spaces */
		  SyStringFullTrim(&sPath);
		  if( sPath.nByte > 0 ){
			  /* Store the path in the corresponding conatiner */
			  rc = SySetPut(&pVm->aPaths, (const void *)&sPath);
		  }
		  break;
									 }
	case JX9_VM_CONFIG_ERR_REPORT:
		/* Run-Time Error report */
		pVm->bErrReport = 1;
		break;
	case JX9_VM_CONFIG_RECURSION_DEPTH:{
		/* Recursion depth */
		int nDepth = va_arg(ap, int);
		if( nDepth > 2 && nDepth < 1024 ){
			pVm->nMaxDepth = nDepth;
		}
		break;
									   }
	case JX9_VM_OUTPUT_LENGTH: {
		/* VM output length in bytes */
		sxu32 *pOut = va_arg(ap, sxu32 *);
#ifdef UNTRUST
		if( pOut == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*pOut = pVm->nOutputLen;
		break;
							   }
	case JX9_VM_CONFIG_CREATE_VAR: {
		/* Create a new superglobal/global variable */
		const char *zName = va_arg(ap, const char *);
		jx9_value *pValue = va_arg(ap, jx9_value *);
		SyHashEntry *pEntry;
		jx9_value *pObj;
		sxu32 nByte;
		sxu32 nIdx; 
#ifdef UNTRUST
		if( SX_EMPTY_STR(zName) || pValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		nByte = SyStrlen(zName);
		/* Check if the superglobal is already installed */
		pEntry = SyHashGet(&pVm->hSuper, (const void *)zName, nByte);
		if( pEntry ){
			/* Variable already installed */
			nIdx = SX_PTR_TO_INT(pEntry->pUserData);
			/* Extract contents */
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( pObj ){
				/* Overwrite old contents */
				jx9MemObjStore(pValue, pObj);
			}
		}else{
			/* Install a new variable */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				rc = SXERR_MEM;
				break;
			}
			/* Copy value */
			jx9MemObjStore(pValue, pObj);
			/* Install the superglobal */
			rc = SyHashInsert(&pVm->hSuper, (const void *)zName, nByte, SX_INT_TO_PTR(nIdx));
		}
		break;
									}
	case JX9_VM_CONFIG_SERVER_ATTR:
	case JX9_VM_CONFIG_ENV_ATTR:  {
		const char *zKey   = va_arg(ap, const char *);
		const char *zValue = va_arg(ap, const char *);
		int nLen = va_arg(ap, int);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		if( nOp == JX9_VM_CONFIG_ENV_ATTR ){
			/* Extract the $_ENV superglobal */
			pValue = VmExtractSuper(&(*pVm), "_ENV", sizeof("_ENV")-1);
		}else{
			/* Extract the $_SERVER superglobal */
			pValue = VmExtractSuper(&(*pVm), "_SERVER", sizeof("_SERVER")-1);
		}
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, zKey, -1, zValue, nLen);
		break;
								   }
	case JX9_VM_CONFIG_ARGV_ENTRY:{
		/* Script arguments */
		const char *zValue = va_arg(ap, const char *);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		/* Extract the $argv array */
		pValue = VmExtractSuper(&(*pVm), "argv", sizeof("argv")-1);
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, 0, 0, zValue,-1);
		if( rc == SXRET_OK && zValue && zValue[0] != 0 ){
			if( pMap->nEntry > 1 ){
				/* Append space separator first */
				SyBlobAppend(&pVm->sArgv, (const void *)" ", sizeof(char));
			}
			SyBlobAppend(&pVm->sArgv, (const void *)zValue,SyStrlen(zValue));
		}
		break;
								  }
	case JX9_VM_CONFIG_EXEC_VALUE: {
		/* Script return value */
		jx9_value **ppValue = va_arg(ap, jx9_value **);
#ifdef UNTRUST
		if( ppValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppValue = &pVm->sExec;
		break;
								   }
	case JX9_VM_CONFIG_IO_STREAM: {
		/* Register an IO stream device */
		const jx9_io_stream *pStream = va_arg(ap, const jx9_io_stream *);
		/* Make sure we are dealing with a valid IO stream */
		if( pStream == 0 || pStream->zName == 0 || pStream->zName[0] == 0 ||
			pStream->xOpen == 0 || pStream->xRead == 0 ){
				/* Invalid stream */
				rc = SXERR_INVALID;
				break;
		}
		if( pVm->pDefStream == 0 && SyStrnicmp(pStream->zName, "file", sizeof("file")-1) == 0 ){
			/* Make the 'file://' stream the defaut stream device */
			pVm->pDefStream = pStream;
		}
		/* Insert in the appropriate container */
		rc = SySetPut(&pVm->aIOstream, (const void *)&pStream);
		break;
								  }
	case JX9_VM_CONFIG_EXTRACT_OUTPUT: {
		/* Point to the VM internal output consumer buffer */
		const void **ppOut = va_arg(ap, const void **);
		unsigned int *pLen = va_arg(ap, unsigned int *);
#ifdef UNTRUST
		if( ppOut == 0 || pLen == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppOut = SyBlobData(&pVm->sConsumer);
		*pLen  = SyBlobLength(&pVm->sConsumer);
		break;
									   }
	case JX9_VM_CONFIG_HTTP_REQUEST:{
		/* Raw HTTP request*/
		const char *zRequest = va_arg(ap, const char *);
		int nByte = va_arg(ap, int);
		if( SX_EMPTY_STR(zRequest) ){
			rc = SXERR_EMPTY;
			break;
		}
		if( nByte < 0 ){
			/* Compute length automatically */
			nByte = (int)SyStrlen(zRequest);
		}
		/* Process the request */
		rc = VmHttpProcessRequest(&(*pVm), zRequest, nByte);
		break;
									}
	default:
		/* Unknown configuration option */
		rc = SXERR_UNKNOWN;
		break;
	}
	return rc;
}